

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

void WriteBinaryDump(aiScene *scene,FILE *_out,char *src,char *cmd,bool _shortened,bool compressed,
                    ImportData *param_7)

{
  FILE *__stream;
  uint uVar1;
  tm *__tp;
  char *pcVar2;
  long lVar3;
  time_t tt;
  char buff [64];
  tm now;
  
  out = _out;
  shortened = _shortened;
  tt = time((time_t *)0x0);
  __tp = gmtime_r(&tt,(tm *)&now);
  __stream = out;
  if (__tp == (tm *)0x0) {
    __assert_fail("nullptr != p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                  ,0x2b3,
                  "void WriteBinaryDump(const aiScene *, FILE *, const char *, const char *, bool, bool, ImportData &)"
                 );
  }
  pcVar2 = asctime(__tp);
  fprintf((FILE *)__stream,"ASSIMP.binary-dump.%s",pcVar2);
  buff[0] = '\x01';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  Write<unsigned_int>((uint *)buff);
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  Write<unsigned_int>((uint *)buff);
  buff._0_4_ = aiGetVersionRevision();
  Write<unsigned_int>((uint *)buff);
  uVar1 = aiGetCompileFlags();
  buff[0] = (char)uVar1;
  buff[1] = (char)(uVar1 >> 8);
  buff[2] = (char)(uVar1 >> 0x10);
  buff[3] = (char)(uVar1 >> 0x18);
  Write<unsigned_int>((uint *)buff);
  buff._0_2_ = (ushort)shortened;
  Write<unsigned_short>((uint16_t *)buff);
  buff[1] = '\0';
  buff[0] = compressed;
  Write<unsigned_short>((uint16_t *)buff);
  strncpy(buff,src,0x100);
  fwrite(buff,0x100,1,(FILE *)out);
  strncpy(buff,cmd,0x80);
  fwrite(buff,0x80,1,(FILE *)out);
  buff[0x30] = -0x33;
  buff[0x31] = -0x33;
  buff[0x32] = -0x33;
  buff[0x33] = -0x33;
  buff[0x34] = -0x33;
  buff[0x35] = -0x33;
  buff[0x36] = -0x33;
  buff[0x37] = -0x33;
  buff[0x38] = -0x33;
  buff[0x39] = -0x33;
  buff[0x3a] = -0x33;
  buff[0x3b] = -0x33;
  buff[0x3c] = -0x33;
  buff[0x3d] = -0x33;
  buff[0x3e] = -0x33;
  buff[0x3f] = -0x33;
  buff[0x20] = -0x33;
  buff[0x21] = -0x33;
  buff[0x22] = -0x33;
  buff[0x23] = -0x33;
  buff[0x24] = -0x33;
  buff[0x25] = -0x33;
  buff[0x26] = -0x33;
  buff[0x27] = -0x33;
  buff[0x28] = -0x33;
  buff[0x29] = -0x33;
  buff[0x2a] = -0x33;
  buff[0x2b] = -0x33;
  buff[0x2c] = -0x33;
  buff[0x2d] = -0x33;
  buff[0x2e] = -0x33;
  buff[0x2f] = -0x33;
  buff[0x10] = -0x33;
  buff[0x11] = -0x33;
  buff[0x12] = -0x33;
  buff[0x13] = -0x33;
  buff[0x14] = -0x33;
  buff[0x15] = -0x33;
  buff[0x16] = -0x33;
  buff[0x17] = -0x33;
  buff[0x18] = -0x33;
  buff[0x19] = -0x33;
  buff[0x1a] = -0x33;
  buff[0x1b] = -0x33;
  buff[0x1c] = -0x33;
  buff[0x1d] = -0x33;
  buff[0x1e] = -0x33;
  buff[0x1f] = -0x33;
  buff[0] = -0x33;
  buff[1] = -0x33;
  buff[2] = -0x33;
  buff[3] = -0x33;
  buff[4] = -0x33;
  buff[5] = -0x33;
  buff[6] = -0x33;
  buff[7] = -0x33;
  buff[8] = -0x33;
  buff[9] = -0x33;
  buff[10] = -0x33;
  buff[0xb] = -0x33;
  buff[0xc] = -0x33;
  buff[0xd] = -0x33;
  buff[0xe] = -0x33;
  buff[0xf] = -0x33;
  fwrite(buff,0x40,1,(FILE *)out);
  lVar3 = ftell((FILE *)out);
  if (lVar3 == 0x200) {
    WriteBinaryScene(scene);
    return;
  }
  __assert_fail("ftell(out)==512",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                ,0x2d8,
                "void WriteBinaryDump(const aiScene *, FILE *, const char *, const char *, bool, bool, ImportData &)"
               );
}

Assistant:

void WriteBinaryDump(const aiScene* scene, FILE* _out, const char* src, const char* cmd, 
	bool _shortened, bool compressed, ImportData& /*imp*/)
{
	out = _out;
	shortened = _shortened;

	time_t tt = time(NULL);
#if _WIN32
    tm* p = gmtime(&tt);
#else
    struct tm now;
    tm* p = gmtime_r(&tt, &now);
#endif
    ai_assert(nullptr != p);

	// header
	fprintf(out,"ASSIMP.binary-dump.%s",asctime(p));
	// == 44 bytes

	Write<unsigned int>(ASSBIN_VERSION_MAJOR);
	Write<unsigned int>(ASSBIN_VERSION_MINOR);
	Write<unsigned int>(aiGetVersionRevision());
	Write<unsigned int>(aiGetCompileFlags());
	Write<uint16_t>(shortened);
	Write<uint16_t>(compressed);
	// ==  20 bytes

	{
		char buff[256] = { 0 };
		strncpy(buff,src,256);
		buff[255] = 0;
		fwrite(buff,256,1,out);
	}

	{
		char buff[128] = { 0 };
		strncpy(buff,cmd,128);
		buff[127] = 0;
		fwrite(buff,128,1,out);
	}

	// leave 64 bytes free for future extensions
	{
		char buff[64];
		memset(buff,0xcd,64);
		fwrite(buff,64,1,out);
	}
	// == 435 bytes

	// ==== total header size: 512 bytes
	ai_assert(ftell(out)==ASSBIN_HEADER_LENGTH);

	// Up to here the data is uncompressed. For compressed files, the rest
	// is compressed using standard DEFLATE from zlib.
	WriteBinaryScene(scene);
}